

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  LogMessage *pLVar4;
  Type *pTVar5;
  Type *pTVar6;
  Type *pTVar7;
  Type *pTVar8;
  int i;
  int iVar9;
  int i_2;
  FileDescriptorProto *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  RepeatedPtrFieldBase *local_70;
  string path;
  
  value_local = value;
  bVar2 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>>
                    (&this->by_name_,(file->name_).ptr_,&value_local);
  if (!bVar2) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&path,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&path,"File already exists in database: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&path);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&path,(string *)(file->package_).ptr_);
    if (path._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&path);
    }
  }
  iVar9 = 0;
  do {
    if ((file->message_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
      iVar9 = 0;
      goto LAB_0030b7b2;
    }
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(file->message_type_).super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_90,&path,(pTVar5->name_).ptr_);
    bVar2 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar2) break;
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                       (&(file->message_type_).super_RepeatedPtrFieldBase,iVar9);
    bVar2 = AddNestedExtensions(this,pTVar5,value_local);
    iVar9 = iVar9 + 1;
  } while (bVar2);
  goto LAB_0030b861;
  while( true ) {
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                       (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_90,&path,(pTVar6->name_).ptr_);
    bVar2 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    iVar9 = iVar9 + 1;
    if (!bVar2) break;
LAB_0030b7b2:
    if ((file->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
      iVar9 = 0;
      goto LAB_0030b800;
    }
  }
  goto LAB_0030b861;
  while( true ) {
    pTVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                       (local_70,iVar9);
    std::operator+(&local_90,&path,(pTVar8->name_).ptr_);
    bVar3 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    iVar9 = iVar9 + 1;
    if (!bVar3) break;
LAB_0030b88f:
    iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
    bVar2 = iVar1 <= iVar9;
    if (iVar1 <= iVar9) break;
  }
  goto LAB_0030b863;
  while( true ) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(file->extension_).super_RepeatedPtrFieldBase,iVar9);
    bVar2 = AddExtension(this,pTVar7,value_local);
    iVar9 = iVar9 + 1;
    if (!bVar2) break;
LAB_0030b800:
    if ((file->extension_).super_RepeatedPtrFieldBase.current_size_ <= iVar9) {
      local_70 = &(file->service_).super_RepeatedPtrFieldBase;
      iVar9 = 0;
      goto LAB_0030b88f;
    }
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(file->extension_).super_RepeatedPtrFieldBase,iVar9);
    std::operator+(&local_90,&path,(pTVar7->name_).ptr_);
    bVar2 = AddSymbol(this,&local_90,value_local);
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar2) break;
  }
LAB_0030b861:
  bVar2 = false;
LAB_0030b863:
  std::__cxx11::string::~string((string *)&path);
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}